

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Export.cpp
# Opt level: O1

int Assimp_Export(char **params,uint num)

{
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char *pcVar3;
  _Alloc_hider _Var4;
  size_type sVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  size_t sVar10;
  size_t index;
  aiExportFormatDesc *paVar11;
  aiScene *pOut;
  ulong uVar12;
  size_type sVar13;
  string outf;
  string out;
  ImportData import;
  string outext;
  string in;
  allocator local_101;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  string local_e0;
  string local_c0;
  ImportData local_a0;
  string local_70;
  string local_50;
  
  if (num == 0) {
    puts("assimp export: Invalid number of arguments. See \'assimp export --help\'");
    return 1;
  }
  pcVar3 = *params;
  iVar7 = strcmp(pcVar3,"-h");
  if (((iVar7 == 0) || (iVar7 = strcmp(pcVar3,"--help"), iVar7 == 0)) ||
     (iVar7 = strcmp(pcVar3,"-?"), iVar7 == 0)) {
    printf("%s",AICMD_MSG_EXPORT_HELP_E);
    return 0;
  }
  std::__cxx11::string::string((string *)&local_50,pcVar3,(allocator *)&local_a0);
  if (num == 1) {
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"-","");
  }
  else {
    std::__cxx11::string::string((string *)&local_c0,params[1],&local_101);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  lVar9 = std::__cxx11::string::rfind((char)&local_c0,0x2e);
  if (lVar9 != -1) {
    std::__cxx11::string::substr((ulong)&local_a0,(ulong)&local_c0);
    std::__cxx11::string::operator=((string *)&local_70,(string *)&local_a0);
    psVar1 = &local_a0.logFile._M_string_length;
    if ((size_type *)CONCAT44(local_a0._4_4_,local_a0.ppFlags) != psVar1) {
      operator_delete((undefined1 *)CONCAT44(local_a0._4_4_,local_a0.ppFlags));
    }
    std::__cxx11::string::substr((ulong)&local_a0,(ulong)&local_c0);
    std::__cxx11::string::operator=((string *)&local_c0,(string *)&local_a0);
    if ((size_type *)CONCAT44(local_a0._4_4_,local_a0.ppFlags) != psVar1) {
      operator_delete((undefined1 *)CONCAT44(local_a0._4_4_,local_a0.ppFlags));
    }
  }
  local_a0.logFile._M_dataplus._M_p = (pointer)&local_a0.logFile.field_2;
  local_a0.ppFlags = 0;
  local_a0._4_4_ = local_a0._4_4_ & 0xffffff00;
  local_a0.logFile._M_string_length = 0;
  local_a0.logFile.field_2._M_local_buf[0] = '\0';
  local_a0.verbose = false;
  local_a0.log = false;
  ProcessStandardArguments(&local_a0,params + 1,num - 1);
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0);
  uVar8 = (*local_c0._M_dataplus._M_p != '-') + 1;
  if (uVar8 < num) {
    paVar2 = &local_100.field_2;
    uVar12 = (ulong)uVar8;
    do {
      pcVar3 = params[uVar12];
      if (pcVar3 != (char *)0x0) {
        iVar7 = strncmp(pcVar3,"-f",2);
        if (iVar7 == 0) {
          iVar7 = strncmp(pcVar3,"-fi",3);
          if (iVar7 != 0) {
            local_100._M_dataplus._M_p = (pointer)paVar2;
            sVar10 = strlen(pcVar3 + 2);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_100,pcVar3 + 2,pcVar3 + sVar10 + 2);
            std::__cxx11::string::operator=((string *)&local_e0,(string *)&local_100);
            goto joined_r0x002f06a8;
          }
        }
        else {
          iVar7 = strncmp(pcVar3,"--format=",9);
          if (iVar7 == 0) {
            local_100._M_dataplus._M_p = (pointer)paVar2;
            sVar10 = strlen(pcVar3 + 9);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_100,pcVar3 + 9,pcVar3 + sVar10 + 9);
            std::__cxx11::string::operator=((string *)&local_e0,(string *)&local_100);
joined_r0x002f06a8:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._M_dataplus._M_p != paVar2) {
              operator_delete(local_100._M_dataplus._M_p);
            }
          }
        }
      }
      uVar12 = uVar12 + 1;
    } while (num != (uint)uVar12);
  }
  sVar5 = local_e0._M_string_length;
  _Var4._M_p = local_e0._M_dataplus._M_p;
  if (local_e0._M_string_length != 0) {
    sVar13 = 0;
    do {
      iVar7 = tolower((int)_Var4._M_p[sVar13]);
      _Var4._M_p[sVar13] = (char)iVar7;
      sVar13 = sVar13 + 1;
    } while (sVar5 != sVar13);
  }
  index = GetMatchingFormat(&local_e0,false);
  if (index == 0xffffffffffffffff) {
    if (local_e0._M_string_length != 0) {
      printf("assimp export: warning, format id \'%s\' is unknown\n",local_e0._M_dataplus._M_p);
    }
    index = GetMatchingFormat(&local_e0,true);
    if (index == 0xffffffffffffffff) {
      index = GetMatchingFormat(&local_70,true);
      if (index == 0xffffffffffffffff) {
        puts("assimp export: no output format specified and I failed to guess it");
        iVar7 = -0x17;
        goto LAB_002f088d;
      }
    }
    else {
      std::__cxx11::string::_M_assign((string *)&local_70);
    }
  }
  if (*local_c0._M_dataplus._M_p == '-') {
    std::__cxx11::string::rfind((char)&local_50,0x2e);
    std::__cxx11::string::substr((ulong)&local_100,(ulong)&local_50);
    std::__cxx11::string::operator=((string *)&local_c0,(string *)&local_100);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p);
    }
  }
  paVar11 = Assimp::Exporter::GetExportFormatDescription(globalExporter,index);
  printf("assimp export: select file format: \'%s\' (%s)\n",paVar11->id,paVar11->description);
  pOut = ImportModel(&local_a0,&local_50);
  if (pOut == (aiScene *)0x0) {
    iVar7 = -0x27;
  }
  else {
    std::operator+(&local_100,".",&local_70);
    std::__cxx11::string::_M_append((char *)&local_c0,(ulong)local_100._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p);
    }
    bVar6 = ExportModel(pOut,&local_a0,&local_c0,paVar11->id);
    iVar7 = -0x19;
    if (bVar6) {
      iVar7 = 0;
      printf("assimp export: wrote output file: %s\n",local_c0._M_dataplus._M_p);
    }
  }
LAB_002f088d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.logFile._M_dataplus._M_p != &local_a0.logFile.field_2) {
    operator_delete(local_a0.logFile._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return iVar7;
}

Assistant:

int Assimp_Export(const char* const* params, unsigned int num)
{
	const char* const invalid = "assimp export: Invalid number of arguments. See \'assimp export --help\'\n";
	if (num < 1) {
		printf(invalid);
		return 1;
	}

	// --help
	if (!strcmp( params[0], "-h") || !strcmp( params[0], "--help") || !strcmp( params[0], "-?") ) {
		printf("%s",AICMD_MSG_EXPORT_HELP_E);
		return 0;
	}

	std::string in  = std::string(params[0]);
	std::string out = (num > 1 ? std::string(params[1]) : "-"), outext;

	// 
	const std::string::size_type s = out.find_last_of('.');
	if (s != std::string::npos) {
		outext = out.substr(s+1);
		out = out.substr(0,s);
	}

	// get import flags
	ImportData import;
	ProcessStandardArguments(import,params+1,num-1);

	// process other flags
	std::string outf = "";
	for (unsigned int i = (out[0] == '-' ? 1 : 2); i < num;++i)		{
		if (!params[i]) {
			continue;
		}
		if (!strncmp( params[i], "-f",2)) {
            if ( strncmp( params[ i ], "-fi",3 ))
			    outf = std::string(params[i]+2);
		}
		else if ( !strncmp( params[i], "--format=",9)) {
			outf = std::string(params[i]+9);
		}
	}

	std::transform(outf.begin(),outf.end(),outf.begin(),::tolower);

	// convert the output format to a format id
	size_t outfi = GetMatchingFormat(outf);
	if (outfi == SIZE_MAX) {
		if (outf.length()) {
			printf("assimp export: warning, format id \'%s\' is unknown\n",outf.c_str());
		}

		// retry to see if we know it as file extension
		outfi = GetMatchingFormat(outf,true);
		if (outfi == SIZE_MAX) {
			// retry to see if we know the file extension of the output file
			outfi = GetMatchingFormat(outext,true);

			if (outfi == SIZE_MAX) {
				// still no match -> failure
				printf("assimp export: no output format specified and I failed to guess it\n");
				return -23;
			}
		}
		else {
			outext = outf;
		}
	}
	
	// if no output file is specified, take the file name from input file
	if (out[0] == '-') {
		std::string::size_type s = in.find_last_of('.');
		if (s == std::string::npos) {
			s = in.length();
		}

		out = in.substr(0,s);
	}

	const aiExportFormatDesc* const e =  globalExporter->GetExportFormatDescription(outfi);
	printf("assimp export: select file format: \'%s\' (%s)\n",e->id,e->description);
	
	// import the  model
	const aiScene* scene = ImportModel(import,in);
	if (!scene) {
		return -39;
	}

	// derive the final file name
	out += "."+outext;

	// and call the export routine
	if(!ExportModel(scene, import, out,e->id)) {
		return -25;
	}
	printf("assimp export: wrote output file: %s\n",out.c_str());
	return 0;
}